

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_QOpenFolderLineEdit.cpp
# Opt level: O3

void QOpenFolderLineEdit::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QString *directory;
  ActionPosition *pAVar1;
  code *pcVar2;
  long lVar3;
  undefined8 uVar4;
  Data *pDVar5;
  char16_t *pcVar6;
  Options OVar7;
  int iVar8;
  undefined4 local_2c;
  QArrayDataPointer<char16_t> local_28;
  
  switch(_c) {
  case InvokeMetaMethod:
    if (_id == 1) {
      local_28.ptr = (char16_t *)_a[1];
      iVar8 = 1;
    }
    else {
      if (_id != 0) {
        return;
      }
      local_2c = *_a[1];
      local_28.ptr = (char16_t *)&local_2c;
      iVar8 = 0;
    }
    local_28.d = (Data *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,iVar8,&local_28.d);
    break;
  case ReadProperty:
    if (4 < (uint)_id) {
      return;
    }
    pAVar1 = (ActionPosition *)*_a;
    switch(_id) {
    case 0:
      OVar7.i = embededActionPosition((QOpenFolderLineEdit *)_o);
      goto LAB_00168399;
    case 1:
      filePath((QString *)&local_28,(QOpenFolderLineEdit *)_o);
      break;
    case 2:
      caption((QString *)&local_28,(QOpenFolderLineEdit *)_o);
      break;
    case 3:
      QOpenFolderLineEdit::directory((QString *)&local_28,(QOpenFolderLineEdit *)_o);
      break;
    case 4:
      OVar7 = options((QOpenFolderLineEdit *)_o);
LAB_00168399:
      *pAVar1 = OVar7.i;
      return;
    }
    pDVar5 = *(Data **)pAVar1;
    pcVar6 = *(char16_t **)(pAVar1 + 2);
    *(Data **)pAVar1 = local_28.d;
    *(char16_t **)(pAVar1 + 2) = local_28.ptr;
    uVar4 = *(undefined8 *)(pAVar1 + 4);
    *(qsizetype *)(pAVar1 + 4) = local_28.size;
    local_28.d = pDVar5;
    local_28.ptr = pcVar6;
    local_28.size = uVar4;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_28);
    break;
  case WriteProperty:
    if ((uint)_id < 5) {
      directory = (QString *)*_a;
      switch(_id) {
      case 0:
        setEmbededActionPosition((QOpenFolderLineEdit *)_o,*(ActionPosition *)&(directory->d).d);
        return;
      case 1:
        setFilePath((QOpenFolderLineEdit *)_o,directory);
        return;
      case 2:
        setCaption((QOpenFolderLineEdit *)_o,directory);
        return;
      case 3:
        setDirectory((QOpenFolderLineEdit *)_o,directory);
        return;
      case 4:
        setOptions((QOpenFolderLineEdit *)_o,(Options)*(Int *)&(directory->d).d);
        return;
      }
    }
    break;
  case IndexOfMethod:
    pcVar2 = *_a[1];
    lVar3 = *(long *)((long)_a[1] + 8);
    if (pcVar2 == embededActionPositionChanged && lVar3 == 0) {
      *(undefined4 *)*_a = 0;
    }
    else if (pcVar2 == filePathChanged && lVar3 == 0) {
      *(undefined4 *)*_a = 1;
    }
  }
  return;
}

Assistant:

void QOpenFolderLineEdit::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<QOpenFolderLineEdit *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->embededActionPositionChanged((*reinterpret_cast< std::add_pointer_t<QLineEdit::ActionPosition>>(_a[1]))); break;
        case 1: _t->filePathChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (QOpenFolderLineEdit::*)(QLineEdit::ActionPosition );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QOpenFolderLineEdit::embededActionPositionChanged)) {
                *result = 0;
                return;
            }
        }
        {
            using _t = void (QOpenFolderLineEdit::*)(const QString & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QOpenFolderLineEdit::filePathChanged)) {
                *result = 1;
                return;
            }
        }
    }
#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<QOpenFolderLineEdit *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< QLineEdit::ActionPosition*>(_v) = _t->embededActionPosition(); break;
        case 1: *reinterpret_cast< QString*>(_v) = _t->filePath(); break;
        case 2: *reinterpret_cast< QString*>(_v) = _t->caption(); break;
        case 3: *reinterpret_cast< QString*>(_v) = _t->directory(); break;
        case 4: *reinterpret_cast< QFileDialog::Options*>(_v) = _t->options(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<QOpenFolderLineEdit *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setEmbededActionPosition(*reinterpret_cast< QLineEdit::ActionPosition*>(_v)); break;
        case 1: _t->setFilePath(*reinterpret_cast< QString*>(_v)); break;
        case 2: _t->setCaption(*reinterpret_cast< QString*>(_v)); break;
        case 3: _t->setDirectory(*reinterpret_cast< QString*>(_v)); break;
        case 4: _t->setOptions(*reinterpret_cast< QFileDialog::Options*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
}